

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::addAtom(RigidBody *this,Atom *at,AtomStamp *ats)

{
  pointer *pppAVar1;
  iterator __position;
  pointer pcVar2;
  bool bVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  value_type *__x;
  long lVar7;
  double __x_00;
  undefined1 auVar8 [16];
  undefined8 uVar10;
  SquareMatrix<double,_3> m;
  RotMat3x3d identMat;
  Atom *local_130;
  double local_128;
  double local_118;
  double local_108;
  double local_f8;
  double local_e8;
  value_type local_d8;
  value_type local_90;
  value_type local_48;
  long lVar9;
  
  __position._M_current =
       (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_130 = at;
  if (__position._M_current ==
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::_M_realloc_insert<OpenMD::Atom*const&>
              ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)&this->atoms_,__position,
               &local_130);
  }
  else {
    *__position._M_current = at;
    pppAVar1 = &(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  if (ats->havePos_ == false) {
    pdVar4 = local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
    pcVar2 = (ats->Type).data_._M_dataplus._M_p;
    local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)pdVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (ats->Type).data_._M_string_length);
    snprintf(painCave.errMsg,2000,
             "RigidBody error.\n\tAtom %s does not have a position specified.\n\tThis means RigidBody cannot set up reference coordinates.\n"
            );
    if ((double *)
        local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
        pdVar4) {
      operator_delete((void *)local_90.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][0],
                      (long)local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                            data_[0][2] + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  local_48.super_Vector<double,_3U>.data_[0] = (ats->position_).super_Vector<double,_3U>.data_[0];
  local_48.super_Vector<double,_3U>.data_[1] = (ats->position_).super_Vector<double,_3U>.data_[1];
  local_48.super_Vector<double,_3U>.data_[2] = (ats->position_).super_Vector<double,_3U>.data_[2];
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->refCoords_,&local_48);
  pdVar4 = local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 1;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar8 = _DAT_0028d380;
    do {
      bVar3 = SUB164(auVar8 ^ _DAT_0028d390,4) == -0x80000000 &&
              SUB164(auVar8 ^ _DAT_0028d390,0) < -0x7ffffffd;
      if (bVar3) {
        uVar10 = 0x3ff0000000000000;
        if (lVar5 != lVar7) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar7 + -8) = uVar10;
      }
      if (bVar3) {
        uVar10 = 0x3ff0000000000000;
        if (lVar5 + -8 != lVar7) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar7) = uVar10;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 8;
    pdVar4 = pdVar4 + 3;
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar5 + 0x10) =
         *(undefined8 *)
          ((long)local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar5 + 0x10);
    uVar10 = *(undefined8 *)
              ((long)local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar5 + 8);
    *(undefined8 *)
     ((long)local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar5
     ) = *(undefined8 *)
          ((long)local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar5);
    *(undefined8 *)
     ((long)local_90.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar5 + 8) = uVar10;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  bVar3 = AtomType::isDirectional(local_130->atomType_);
  if (bVar3) {
    if (ats->haveOrt_ == false) {
      pdVar4 = local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
      pcVar2 = (ats->Type).data_._M_dataplus._M_p;
      local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           (double)pdVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + (ats->Type).data_._M_string_length);
      snprintf(painCave.errMsg,2000,
               "RigidBody error.\n\tAtom %s does not have an orientation specified.\n\tThis means RigidBody cannot set up reference orientations.\n"
               ,local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0])
      ;
      if ((double *)
          local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
          pdVar4) {
        operator_delete((void *)local_d8.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0],
                        (long)local_d8.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
      }
      painCave.isFatal = 1;
      simError();
    }
    local_118 = ((ats->orientation_).super_Vector<double,_3U>.data_[0] * 3.141592653589793) / 180.0;
    local_128 = ((ats->orientation_).super_Vector<double,_3U>.data_[1] * 3.141592653589793) / 180.0;
    __x_00 = ((ats->orientation_).super_Vector<double,_3U>.data_[2] * 3.141592653589793) / 180.0;
    local_f8 = sin(local_118);
    local_e8 = sin(local_128);
    local_108 = sin(__x_00);
    local_118 = cos(local_118);
    local_128 = cos(local_128);
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         cos(__x_00);
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
         local_e8 * local_108;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         local_118 + local_108 * -local_128 * local_f8;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
         local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         local_f8 + local_108 * local_128 * local_118;
    __x = &local_d8;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         -local_128 * local_f8 - local_118 * local_108;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
         local_128 * local_118 - local_f8 * local_108;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         local_e8 *
         local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
         local_e8 * local_f8;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
         -local_e8 * local_118;
    local_d8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = local_128;
  }
  else {
    __x = &local_90;
  }
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back(&this->refOrients_,__x);
  return;
}

Assistant:

void RigidBody::addAtom(Atom* at, AtomStamp* ats) {
    Vector3d coords;
    Vector3d euler;

    atoms_.push_back(at);

    if (!ats->havePosition()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RigidBody error.\n"
               "\tAtom %s does not have a position specified.\n"
               "\tThis means RigidBody cannot set up reference coordinates.\n",
               ats->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    coords[0] = ats->getPosX();
    coords[1] = ats->getPosY();
    coords[2] = ats->getPosZ();

    refCoords_.push_back(coords);

    RotMat3x3d identMat = RotMat3x3d::identity();

    if (at->isDirectional()) {
      if (!ats->haveOrientation()) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "RigidBody error.\n"
            "\tAtom %s does not have an orientation specified.\n"
            "\tThis means RigidBody cannot set up reference orientations.\n",
            ats->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

      euler[0] = ats->getEulerPhi() * Constants::PI / 180.0;
      euler[1] = ats->getEulerTheta() * Constants::PI / 180.0;
      euler[2] = ats->getEulerPsi() * Constants::PI / 180.0;

      RotMat3x3d Atmp(euler);
      refOrients_.push_back(Atmp);

    } else {
      refOrients_.push_back(identMat);
    }
  }